

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_color_ez(rf_image *__return_storage_ptr__,int width,int height,rf_color color)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  iVar3 = height * width;
  pvVar1 = malloc((long)(iVar3 * 4));
  if (pvVar1 != (void *)0x0) {
    if (0 < iVar3) {
      lVar2 = 0;
      do {
        *(rf_color *)((long)pvVar1 + lVar2 * 4) = color;
        lVar2 = lVar2 + 1;
      } while (iVar3 != lVar2);
    }
    __return_storage_ptr__->data = pvVar1;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_ez(int width, int height, rf_color color) { return rf_gen_image_color(width, height, color, RF_DEFAULT_ALLOCATOR); }